

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

void __thiscall cmDependsFortran::MatchLocalModules(cmDependsFortran *this)

{
  char *stampDir;
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  
  p_Var1 = (this->Internal->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->Internal->TargetProvides)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    stampDir = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
    do {
      ConsiderModule(this,*(char **)(p_Var1 + 1),stampDir);
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return;
}

Assistant:

void cmDependsFortran::MatchLocalModules()
{
  const char* stampDir = this->TargetDirectory.c_str();
  std::set<std::string> const& provides = this->Internal->TargetProvides;
  for (std::set<std::string>::const_iterator i = provides.begin();
       i != provides.end(); ++i) {
    this->ConsiderModule(i->c_str(), stampDir);
  }
}